

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxDoWhileLoop::DoResolve(FxDoWhileLoop *this,FCompileContext *ctx)

{
  BYTE BVar1;
  PString *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxBoolCast *this_00;
  FxExpression *pFVar4;
  FxDoWhileLoop *pFVar5;
  FScriptPosition *other;
  bool bVar6;
  FString local_30;
  
  if ((this->super_FxLoopStatement).super_FxExpression.isresolved != false) {
    return (FxExpression *)this;
  }
  (this->super_FxLoopStatement).super_FxExpression.isresolved = true;
  pFVar4 = this->Condition;
  if (pFVar4 != (FxExpression *)0x0) {
    iVar3 = (*pFVar4->_vptr_FxExpression[2])(pFVar4,ctx);
    this->Condition = (FxExpression *)CONCAT44(extraout_var,iVar3);
  }
  if (this->Condition == (FxExpression *)0x0) {
LAB_0053ac11:
    (*(this->super_FxLoopStatement).super_FxExpression._vptr_FxExpression[1])(this);
    pFVar5 = (FxDoWhileLoop *)0x0;
  }
  else {
    pFVar4 = this->Code;
    if (pFVar4 != (FxExpression *)0x0) {
      iVar3 = (*pFVar4->_vptr_FxExpression[2])(pFVar4,ctx);
      this->Code = (FxExpression *)CONCAT44(extraout_var_00,iVar3);
      if ((FxExpression *)CONCAT44(extraout_var_00,iVar3) == (FxExpression *)0x0) goto LAB_0053ac11;
    }
    if (this->Condition->ValueType != (PType *)TypeBool) {
      this_00 = (FxBoolCast *)FMemArena::Alloc(&FxAlloc,0x38);
      pFVar4 = this->Condition;
      (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
      FScriptPosition::FScriptPosition
                (&(this_00->super_FxExpression).ScriptPosition,&pFVar4->ScriptPosition);
      (this_00->super_FxExpression).ValueType = (PType *)0x0;
      (this_00->super_FxExpression).isresolved = false;
      (this_00->super_FxExpression).NeedResult = true;
      (this_00->super_FxExpression).ExprType = EFX_BoolCast;
      (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxBoolCast_0070f548;
      this_00->basex = pFVar4;
      (this_00->super_FxExpression).ValueType = (PType *)TypeBool;
      this_00->NeedValue = true;
      this->Condition = (FxExpression *)this_00;
      pFVar4 = FxBoolCast::Resolve(this_00,ctx);
      this->Condition = pFVar4;
      if (pFVar4 == (FxExpression *)0x0) goto LAB_0053ac11;
    }
    iVar3 = (*this->Condition->_vptr_FxExpression[3])();
    pFVar5 = this;
    if ((char)iVar3 != '\0') {
      pPVar2 = (PString *)this->Condition[1]._vptr_FxExpression;
      other = &this->Condition[1].ScriptPosition;
      if (pPVar2 == TypeString) {
        FString::AttachToOther(&local_30,&other->FileName);
      }
      else {
        local_30.Chars = (other->FileName).Chars;
      }
      BVar1 = (pPVar2->super_PBasicType).super_PType.RegType;
      if (BVar1 == '\x01') {
        bVar6 = (double)local_30.Chars != 0.0;
      }
      else if (BVar1 == '\0') {
        bVar6 = (int)local_30.Chars != 0;
      }
      else {
        bVar6 = false;
      }
      if (pPVar2 == TypeString) {
        FString::~FString(&local_30);
      }
      if (bVar6) {
        if (this->Code == (FxExpression *)0x0) {
          FScriptPosition::Message
                    (&(this->super_FxLoopStatement).super_FxExpression.ScriptPosition,0,
                     "Infinite empty loop");
        }
      }
      else if ((this->super_FxLoopStatement).Jumps.Count == 0) {
        pFVar5 = (FxDoWhileLoop *)this->Code;
        if (pFVar5 == (FxDoWhileLoop *)0x0) {
          pFVar5 = (FxDoWhileLoop *)FMemArena::Alloc(&FxAlloc,0x28);
          (pFVar5->super_FxLoopStatement).super_FxExpression._vptr_FxExpression =
               (_func_int **)&PTR__FxExpression_00711370;
          FScriptPosition::FScriptPosition
                    (&(pFVar5->super_FxLoopStatement).super_FxExpression.ScriptPosition,
                     &(this->super_FxLoopStatement).super_FxExpression.ScriptPosition);
          (pFVar5->super_FxLoopStatement).super_FxExpression.ValueType = (PType *)0x0;
          (pFVar5->super_FxLoopStatement).super_FxExpression.ExprType = EFX_Nop;
          (pFVar5->super_FxLoopStatement).super_FxExpression._vptr_FxExpression =
               (_func_int **)&PTR__FxExpression_00711e78;
          (pFVar5->super_FxLoopStatement).super_FxExpression.isresolved = true;
          (pFVar5->super_FxLoopStatement).super_FxExpression.NeedResult = true;
        }
        this->Code = (FxExpression *)0x0;
        (*(this->super_FxLoopStatement).super_FxExpression._vptr_FxExpression[1])(this);
      }
    }
  }
  return (FxExpression *)pFVar5;
}

Assistant:

FxExpression *FxDoWhileLoop::DoResolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Condition, ctx);
	SAFE_RESOLVE_OPT(Code, ctx);

	if (Condition->ValueType != TypeBool)
	{
		Condition = new FxBoolCast(Condition);
		SAFE_RESOLVE(Condition, ctx);
	}

	if (Condition->isConstant())
	{
		if (static_cast<FxConstant *>(Condition)->GetValue().GetBool() == false)
		{ // The code executes once, if any.
			if (Jumps.Size() == 0)
			{ // We would still have to handle the jumps however.
				FxExpression *e = Code;
				if (e == nullptr) e = new FxNop(ScriptPosition);
				Code = nullptr;
				delete this;
				return e;
			}
		}
		else if (Code == nullptr)
		{ // "do { } while (true);"
		  // Someone could be using this for testing.
			ScriptPosition.Message(MSG_WARNING, "Infinite empty loop");
		}
	}

	return this;
}